

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bswap.c
# Opt level: O3

void mpt_bswap_80(long len,mpt_float80 *val)

{
  long lVar1;
  long lVar2;
  mpt_float80 *pmVar3;
  uint8_t uStack_11;
  uint8_t tmp [10];
  
  if (0 < len) {
    lVar1 = 0;
    do {
      tmp._8_2_ = val->_prefix;
      tmp._0_8_ = *(undefined8 *)val->_mantissa;
      lVar2 = 10;
      pmVar3 = val;
      do {
        pmVar3->_mantissa[0] = tmp[lVar2 + -1];
        pmVar3 = (mpt_float80 *)(pmVar3->_mantissa + 1);
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      val = val + 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != len);
  }
  return;
}

Assistant:

extern void mpt_bswap_80(long len, MPT_STRUCT(float80) *val)
{
	long i;
	for (i = 0; i < len; ++i) {
		uint8_t tmp[sizeof(*val)], *ptr = (uint8_t *) val++;
		unsigned pos;
		for (pos = 0; pos < sizeof(tmp); pos++) {
			tmp[pos] = ptr[pos];
		}
		for (pos = 0; pos < sizeof(tmp); pos++) {
			ptr[pos] = tmp[sizeof(tmp) - 1 - pos];
		}
	}
}